

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_pcd
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  REF_NODE ref_node_00;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  FILE *file;
  REF_NODE ref_node;
  char *filename_local;
  char **scalar_names_local;
  REF_DBL *scalar_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_node_synchronize_globals(ref_node_00);
  if (ref_grid_local._4_4_ == 0) {
    _ref_private_macro_code_rss = (FILE *)0x0;
    if (ref_grid->mpi->id == 0) {
      _ref_private_macro_code_rss = fopen(filename,"w");
      if (_ref_private_macro_code_rss == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xd0e,"ref_gather_scalar_pcd","unable to open file");
        return 2;
      }
      fprintf(_ref_private_macro_code_rss,"# .PCD v.7 - Point Cloud Data file format\n");
      fprintf(_ref_private_macro_code_rss,"VERSION .7\n");
      fprintf(_ref_private_macro_code_rss,"FIELDS x y z");
      if (scalar_names == (char **)0x0) {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ldim;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          fprintf(_ref_private_macro_code_rss," V%d",(ulong)(ref_private_macro_code_rss_1 + 1));
        }
      }
      else {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ldim;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          fprintf(_ref_private_macro_code_rss," %s",scalar_names[ref_private_macro_code_rss_1]);
        }
      }
      fprintf(_ref_private_macro_code_rss,"\n");
      fprintf(_ref_private_macro_code_rss,"SIZE");
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ldim + 3;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        fprintf(_ref_private_macro_code_rss," 4");
      }
      fprintf(_ref_private_macro_code_rss,"\n");
      fprintf(_ref_private_macro_code_rss,"TYPE");
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ldim + 3;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        fprintf(_ref_private_macro_code_rss," F");
      }
      fprintf(_ref_private_macro_code_rss,"\n");
      fprintf(_ref_private_macro_code_rss,"COUNT");
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ldim + 3;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        fprintf(_ref_private_macro_code_rss," 1");
      }
      fprintf(_ref_private_macro_code_rss,"\n");
      fprintf(_ref_private_macro_code_rss,"WIDTH %ld\n",ref_node_00->old_n_global);
      fprintf(_ref_private_macro_code_rss,"VIEWPOINT 0 0 0 1 0 0 0\n");
      fprintf(_ref_private_macro_code_rss,"POINTS %ld\n",ref_node_00->old_n_global);
      fprintf(_ref_private_macro_code_rss,"DATA ascii\n");
    }
    ref_grid_local._4_4_ =
         ref_gather_node_scalar_txt
                   (ref_node_00,ldim,scalar," ",1,(FILE *)_ref_private_macro_code_rss);
    if (ref_grid_local._4_4_ == 0) {
      if (ref_grid->mpi->id == 0) {
        fclose(_ref_private_macro_code_rss);
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xd28,"ref_gather_scalar_pcd",(ulong)ref_grid_local._4_4_,"text export");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xd08,
           "ref_gather_scalar_pcd",(ulong)ref_grid_local._4_4_,"sync");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_pcd(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char **scalar_names,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT i;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "# .PCD v.7 - Point Cloud Data file format\n");
    fprintf(file, "VERSION .7\n");
    fprintf(file, "FIELDS x y z");
    if (NULL != scalar_names) {
      for (i = 0; i < ldim; i++) fprintf(file, " %s", scalar_names[i]);
    } else {
      for (i = 0; i < ldim; i++) fprintf(file, " V%d", i + 1);
    }
    fprintf(file, "\n");
    fprintf(file, "SIZE");
    for (i = 0; i < 3 + ldim; i++) fprintf(file, " 4");
    fprintf(file, "\n");
    fprintf(file, "TYPE");
    for (i = 0; i < 3 + ldim; i++) fprintf(file, " F");
    fprintf(file, "\n");
    fprintf(file, "COUNT");
    for (i = 0; i < 3 + ldim; i++) fprintf(file, " 1");
    fprintf(file, "\n");
    fprintf(file, "WIDTH " REF_GLOB_FMT "\n", ref_node_n_global(ref_node));
    fprintf(file, "VIEWPOINT 0 0 0 1 0 0 0\n");
    fprintf(file, "POINTS " REF_GLOB_FMT "\n", ref_node_n_global(ref_node));
    fprintf(file, "DATA ascii\n");
  }

  RSS(ref_gather_node_scalar_txt(ref_node, ldim, scalar, " ", REF_TRUE, file),
      "text export");

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}